

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.cpp
# Opt level: O1

void Timidity::pre_resample(Renderer *song,Sample *sp)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  short sVar4;
  float *pfVar5;
  ulong uVar6;
  float fVar7;
  uint uVar8;
  float *pfVar9;
  float *pfVar11;
  int m;
  uint uVar12;
  uint uVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  ulong uVar10;
  
  if (sp->scale_factor != 0) {
    return;
  }
  pfVar5 = sp->data;
  sVar4 = sp->scale_note;
  cmsg(0,2," * pre-resampling for note %d (%s%d)\n",(long)sVar4,
       pre_resample::note_name +
       (int)((int)sVar4 +
            (((uint)((int)sVar4 / 6 + ((int)sVar4 >> 0x1f)) >> 1) -
            (int)((long)sVar4 * 0x2aaaaaab >> 0x3f)) * -0xc),(ulong)((int)sVar4 & 0x7c) / 0xc);
  iVar14 = sp->sample_rate;
  dVar17 = exp2((double)(int)sp->scale_note * 0.08333333333333333);
  fVar15 = ((float)(dVar17 * 8175.798947309669) * (float)iVar14) / (song->rate * sp->root_freq);
  if ((0.0 < fVar15) && (uVar12 = (uint)((float)sp->data_length / fVar15), -1 < (int)uVar12)) {
    uVar13 = uVar12 >> 0xc;
    pfVar9 = (float *)safe_malloc((ulong)(uVar13 * 4));
    uVar6 = (long)(sp->data_length + -0x1000) / (long)(int)uVar13;
    uVar10 = uVar6 & 0xffffffff;
    uVar8 = (uint)uVar6;
    pfVar11 = pfVar9;
    if (uVar13 != 1) {
      pfVar11 = pfVar9 + 1;
      *pfVar9 = *pfVar5;
    }
    iVar14 = uVar13 - 2;
    uVar13 = uVar8;
    for (; iVar14 != 0; iVar14 = iVar14 + -1) {
      uVar13 = (uint)uVar10;
      pfVar1 = pfVar5 + ((int)uVar13 >> 0xc);
      fVar16 = pfVar1[(ulong)(uVar13 < 0x1000) - 1];
      fVar2 = *pfVar1;
      fVar3 = pfVar1[1];
      fVar7 = (float)(uVar13 & 0xfff) * 0.00024414062;
      *pfVar11 = ((((fVar2 - fVar3) * 3.0 + (pfVar1[2] - fVar16)) * fVar7 +
                  ((fVar16 - (fVar2 + fVar2)) + fVar3) * 3.0) * fVar7 +
                 (((fVar2 * -3.0 - (fVar16 + fVar16)) + fVar3 * 6.0) - pfVar1[2])) *
                 fVar7 * 0.16666667 + fVar2;
      pfVar11 = pfVar11 + 1;
      uVar13 = uVar13 + uVar8;
      uVar10 = (ulong)uVar13;
    }
    fVar16 = pfVar5[(int)uVar13 >> 0xc];
    if ((uVar13 & 0xfff) != 0) {
      fVar16 = fVar16 + (float)(uVar13 & 0xfff) * 0.00024414062 *
                        (pfVar5[(long)((int)uVar13 >> 0xc) + 1] - fVar16);
    }
    *pfVar11 = fVar16;
    sp->data_length = uVar12;
    sp->loop_start = (int)((float)sp->loop_start * (1.0 / fVar15));
    sp->loop_end = (int)((float)sp->loop_end * (1.0 / fVar15));
    free(sp->data);
    sp->data = pfVar9;
    sp->sample_rate = 0;
  }
  return;
}

Assistant:

void pre_resample(Renderer *song, Sample *sp)
{
	double a, xdiff;
	int incr, ofs, newlen, count;
	sample_t *newdata, *dest, *src = sp->data;
	sample_t v1, v2, v3, v4, *vptr;
	static const char note_name[12][3] =
	{
		"C", "C#", "D", "D#", "E", "F", "F#", "G", "G#", "A", "A#", "B"
	};

	if (sp->scale_factor != 0)
		return;

	cmsg(CMSG_INFO, VERB_NOISY, " * pre-resampling for note %d (%s%d)\n",
		sp->scale_note,
		note_name[sp->scale_note % 12], (sp->scale_note & 0x7F) / 12);

	a = (sp->sample_rate * note_to_freq(sp->scale_note)) / (sp->root_freq * song->rate);
	if (a <= 0)
		return;
	newlen = (int)(sp->data_length / a);
	if (newlen < 0 || (newlen >> FRACTION_BITS) > MAX_SAMPLE_SIZE)
		return;

	count = newlen >> FRACTION_BITS;
	dest = newdata = (sample_t *)safe_malloc(count * sizeof(float));

	ofs = incr = (sp->data_length - (1 << FRACTION_BITS)) / count;

	if (--count)
		*dest++ = src[0];

	/* Since we're pre-processing and this doesn't have to be done in
	real-time, we go ahead and do the full sliding cubic interpolation. */
	while (--count)
	{
		vptr = src + (ofs >> FRACTION_BITS);
		v1 = (vptr == src) ? *vptr : *(vptr - 1);
		v2 = *vptr;
		v3 = *(vptr + 1);
		v4 = *(vptr + 2);
		xdiff = FSCALENEG(ofs & FRACTION_MASK, FRACTION_BITS);
		*dest++ = sample_t(v2 + (xdiff / 6.0) * (-2 * v1 - 3 * v2 + 6 * v3 - v4 +
			xdiff * (3 * (v1 - 2 * v2 + v3) + xdiff * (-v1 + 3 * (v2 - v3) + v4))));
		ofs += incr;
	}

	if (ofs & FRACTION_MASK)
	{
		RESAMPLATION
	}
	else
	{
		*dest++ = src[ofs >> FRACTION_BITS];
	}

	sp->data_length = newlen;
	sp->loop_start = int(sp->loop_start / a);
	sp->loop_end = int(sp->loop_end / a);
	free(sp->data);
	sp->data = newdata;
	sp->sample_rate = 0;
}